

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t
spvtools::val::FindCaseFallThrough
          (ValidationState_t *_,BasicBlock *target_block,uint32_t *case_fall_through,
          BasicBlock *merge,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *case_targets,Function *function)

{
  bool bVar1;
  pointer ppBVar2;
  ValidationState_t *pVVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  pointer ppBVar7;
  spv_result_t sVar8;
  __ireturn_type _Var9;
  value_type block;
  BasicBlock *target_block_local;
  uint32_t *local_2e0;
  int local_2d4;
  ValidationState_t *local_2d0;
  Function *local_2c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2c0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  string local_2a0;
  string local_280;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  string local_228;
  BasicBlock *successor;
  spv_result_t local_38;
  
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  target_block_local = target_block;
  local_2e0 = case_fall_through;
  local_2d0 = _;
  local_2c0 = &case_targets->_M_h;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            (&stack,&target_block_local);
  visited._M_h._M_buckets = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = target_block_local->structurally_reachable_;
  local_2c8 = function;
  local_2d4 = Function::GetBlockDepth(function,target_block_local);
  do {
    while( true ) {
      while( true ) {
        do {
          if (stack.
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              stack.
              super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            sVar8 = SPV_SUCCESS;
            goto LAB_0026cfc9;
          }
          block = stack.
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
          stack.
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               stack.
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        } while ((block == merge) ||
                (_Var9 = std::__detail::
                         _Insert_base<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::insert((_Insert_base<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                   *)&visited,&block),
                ((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0));
        if ((bVar1 == false) ||
           ((block->structurally_reachable_ != true ||
            (bVar4 = BasicBlock::structurally_dominates(target_block_local,block), !bVar4)))) break;
        ppBVar2 = (block->successors_).
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar7 = (block->successors_).
                       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
            ppBVar7 = ppBVar7 + 1) {
          successor = *ppBVar7;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back(&stack,&successor);
        }
      }
      successor = (BasicBlock *)CONCAT44(successor._4_4_,block->id_);
      sVar6 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_2c0,(key_type_conflict *)&successor);
      pVVar3 = local_2d0;
      if (sVar6 == 0) break;
      if (*local_2e0 == 0) {
        if (target_block_local != block) {
          *local_2e0 = block->id_;
        }
      }
      else if (*local_2e0 != block->id_) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&successor,local_2d0,SPV_ERROR_INVALID_CFG,
                   target_block_local->label_);
        std::operator<<((ostream *)&successor,"Case construct that targets ");
        ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,target_block_local->id_);
        std::operator<<((ostream *)&successor,(string *)&local_280);
        std::operator<<((ostream *)&successor,
                        " has branches to multiple other case construct targets ");
        ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,*local_2e0);
        std::operator<<((ostream *)&successor,(string *)&local_2a0);
        std::operator<<((ostream *)&successor," and ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,pVVar3,block->id_);
        std::operator<<((ostream *)&successor,(string *)&local_228);
        std::__cxx11::string::_M_dispose();
        sVar8 = local_38;
        goto LAB_0026d15c;
      }
    }
    iVar5 = Function::GetBlockDepth(local_2c8,block);
  } while ((iVar5 < local_2d4) ||
          ((iVar5 == local_2d4 && (bVar4 = std::bitset<7UL>::test(&block->type_,5), bVar4))));
  pVVar3 = local_2d0;
  ValidationState_t::diag
            ((DiagnosticStream *)&successor,local_2d0,SPV_ERROR_INVALID_CFG,
             target_block_local->label_);
  std::operator<<((ostream *)&successor,"Case construct that targets ");
  ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,target_block_local->id_);
  std::operator<<((ostream *)&successor,(string *)&local_280);
  std::operator<<((ostream *)&successor," has invalid branch to block ");
  ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,block->id_);
  std::operator<<((ostream *)&successor,(string *)&local_2a0);
  std::operator<<((ostream *)&successor,
                  " (not another case construct, corresponding merge, outer loop merge or outer loop continue)"
                 );
  sVar8 = local_38;
LAB_0026d15c:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&successor);
LAB_0026cfc9:
  std::
  _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&visited._M_h);
  std::_Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
  ~_Vector_base(&stack.
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               );
  return sVar8;
}

Assistant:

spv_result_t FindCaseFallThrough(
    ValidationState_t& _, BasicBlock* target_block, uint32_t* case_fall_through,
    const BasicBlock* merge, const std::unordered_set<uint32_t>& case_targets,
    Function* function) {
  std::vector<BasicBlock*> stack;
  stack.push_back(target_block);
  std::unordered_set<const BasicBlock*> visited;
  bool target_reachable = target_block->structurally_reachable();
  int target_depth = function->GetBlockDepth(target_block);
  while (!stack.empty()) {
    auto block = stack.back();
    stack.pop_back();

    if (block == merge) continue;

    if (!visited.insert(block).second) continue;

    if (target_reachable && block->structurally_reachable() &&
        target_block->structurally_dominates(*block)) {
      // Still in the case construct.
      for (auto successor : *block->successors()) {
        stack.push_back(successor);
      }
    } else {
      // Exiting the case construct to non-merge block.
      if (!case_targets.count(block->id())) {
        int depth = function->GetBlockDepth(block);
        if ((depth < target_depth) ||
            (depth == target_depth && block->is_type(kBlockTypeContinue))) {
          continue;
        }

        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has invalid branch to block " << _.getIdName(block->id())
               << " (not another case construct, corresponding merge, outer "
                  "loop merge or outer loop continue)";
      }

      if (*case_fall_through == 0u) {
        if (target_block != block) {
          *case_fall_through = block->id();
        }
      } else if (*case_fall_through != block->id()) {
        // Case construct has at most one branch to another case construct.
        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has branches to multiple other case construct targets "
               << _.getIdName(*case_fall_through) << " and "
               << _.getIdName(block->id());
      }
    }
  }

  return SPV_SUCCESS;
}